

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O0

size_t JEBDebug::internal::print_hex_numbers
                 (ostream *stream,void *data,size_t num_bytes,size_t num_numbers)

{
  ulong uVar1;
  size_t sVar2;
  fmtflags __fmtfl;
  _Setw _Var3;
  unsigned_long *puVar4;
  ostream *poVar5;
  uchar *cdata;
  unsigned_long n;
  size_t i;
  char_type fill;
  size_t sStack_28;
  fmtflags flags;
  size_t num_numbers_local;
  size_t num_bytes_local;
  void *data_local;
  ostream *stream_local;
  
  sStack_28 = num_numbers;
  num_numbers_local = num_bytes;
  num_bytes_local = (size_t)data;
  data_local = stream;
  __fmtfl = std::ios_base::setf((ios_base *)(stream + *(long *)(*(long *)stream + -0x18)),_S_hex,
                                _S_basefield);
  std::ios::fill((char)data_local + (char)*(undefined8 *)(*data_local + -0x18));
  n = 0;
  puVar4 = std::min<unsigned_long>(&num_numbers_local,&stack0xffffffffffffffd8);
  sVar2 = num_bytes_local;
  uVar1 = *puVar4;
  for (; n < uVar1; n = n + 1) {
    poVar5 = std::operator<<((ostream *)data_local,' ');
    _Var3 = std::setw(2);
    poVar5 = std::operator<<(poVar5,_Var3);
    std::ostream::operator<<(poVar5,(uint)*(byte *)(sVar2 + n));
  }
  for (; n < sStack_28; n = n + 1) {
    std::operator<<((ostream *)data_local,"   ");
  }
  std::ios::fill((char)data_local + (char)*(undefined8 *)(*data_local + -0x18));
  std::ios_base::flags((ios_base *)((long)data_local + *(long *)(*data_local + -0x18)),__fmtfl);
  return uVar1;
}

Assistant:

inline size_t print_hex_numbers(std::ostream& stream,
                                        const void* data, size_t num_bytes,
                                        size_t num_numbers)
        {
            auto flags = stream.setf(std::ios::hex, std::ios::basefield);
            auto fill = stream.fill('0');
            size_t i = 0;
            auto n = std::min(num_bytes, num_numbers);
            const auto* cdata = static_cast<const unsigned char*>(data);
            for (; i < n; ++i)
                stream << ' ' << std::setw(2) << unsigned(cdata[i]);
            for (; i < num_numbers; ++i)
                stream << "   ";
            stream.fill(fill);
            stream.flags(flags);
            return n;
        }